

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaUtilityTargetGenerator.cxx
# Opt level: O3

void __thiscall cmNinjaUtilityTargetGenerator::Generate(cmNinjaUtilityTargetGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  cmMakefile *this_00;
  cmGeneratorTarget *this_01;
  cmLocalNinjaGenerator *pcVar5;
  bool bVar6;
  TargetType TVar7;
  char *pcVar8;
  long *plVar9;
  cmGlobalNinjaGenerator *pcVar10;
  string *psVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  MapToNinjaPathImpl MVar13;
  long lVar14;
  cmCustomCommand *pcVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar16;
  cmGeneratedFileStream *pcVar17;
  size_type *psVar18;
  pointer cc;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  bool uses_terminal;
  pointer ppcVar21;
  string local_258;
  allocator_type local_229;
  cmCustomCommandGenerator ccg;
  string command;
  string desc;
  string local_168;
  string config;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  cmNinjaDeps deps;
  string utilCommandName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  cmNinjaDeps outputs;
  cmNinjaDeps util_outputs;
  cmNinjaDeps local_78;
  long local_60;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *cmdLists [2];
  cmNinjaDeps local_48;
  
  pcVar8 = cmLocalGenerator::GetCurrentBinaryDirectory
                     ((cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
  std::__cxx11::string::string((string *)&utilCommandName,pcVar8,(allocator *)&ccg);
  std::__cxx11::string::append((char *)&utilCommandName);
  std::__cxx11::string::append((char *)&utilCommandName);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&config,&this->super_cmNinjaTargetGenerator);
  plVar9 = (long *)std::__cxx11::string::append((char *)&config);
  ccg.CC = (cmCustomCommand *)&ccg.Config._M_string_length;
  pcVar15 = (cmCustomCommand *)(plVar9 + 2);
  if ((cmCustomCommand *)*plVar9 == pcVar15) {
    ccg.Config._M_string_length =
         (size_type)
         (pcVar15->Outputs).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ccg.Config.field_2._M_allocated_capacity = plVar9[3];
  }
  else {
    ccg.Config._M_string_length =
         (size_type)
         (pcVar15->Outputs).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ccg.CC = (cmCustomCommand *)*plVar9;
  }
  ccg.Config._M_dataplus._M_p = (pointer)plVar9[1];
  *plVar9 = (long)pcVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&utilCommandName,(ulong)ccg.CC);
  if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
    operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)config._M_dataplus._M_p != &config.field_2) {
    operator_delete(config._M_dataplus._M_p,config.field_2._M_allocated_capacity + 1);
  }
  pcVar10 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath((string *)&ccg,pcVar10,&utilCommandName);
  std::__cxx11::string::operator=((string *)&utilCommandName,(string *)&ccg);
  if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
    operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
  }
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&util_outputs,1,&utilCommandName,(allocator_type *)&ccg);
  cmdLists[0] = cmGeneratorTarget::GetPreBuildCommands
                          ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                           GeneratorTarget);
  cmdLists[1] = cmGeneratorTarget::GetPostBuildCommands
                          ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                           GeneratorTarget);
  lVar14 = 0;
  uses_terminal = false;
  do {
    pvVar2 = cmdLists[lVar14];
    cc = (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
         super__Vector_impl_data._M_start;
    local_60 = lVar14;
    if (cc != (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
              _M_impl.super__Vector_impl_data._M_finish) {
      do {
        psVar11 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this)
        ;
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  (&ccg,cc,psVar11,
                   (cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
        cmLocalNinjaGenerator::AppendCustomCommandDeps
                  ((this->super_cmNinjaTargetGenerator).LocalGenerator,&ccg,&deps);
        cmLocalNinjaGenerator::AppendCustomCommandLines
                  ((this->super_cmNinjaTargetGenerator).LocalGenerator,&ccg,&commands);
        pvVar12 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
        _Var3._M_current =
             (pvVar12->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        _Var4._M_current =
             (pvVar12->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        MVar13.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                  (_Var3,_Var4,&util_outputs,MVar13);
        bVar6 = cmCustomCommand::GetUsesTerminal(cc);
        uses_terminal = (bool)(uses_terminal | bVar6);
        cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
        cc = cc + 1;
      } while (cc != (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)
                     ._M_impl.super__Vector_impl_data._M_finish);
    }
    lVar14 = local_60 + 1;
  } while (lVar14 != 2);
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  ccg.CC = (cmCustomCommand *)&ccg.Config._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ccg,"CMAKE_BUILD_TYPE","");
  pcVar8 = cmMakefile::GetSafeDefinition(this_00,(string *)&ccg);
  std::__cxx11::string::string((string *)&config,pcVar8,(allocator *)&command);
  if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
    operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
  }
  cmGeneratorTarget::GetSourceFiles
            ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &sources,&config);
  if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar21 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      pcVar15 = cmSourceFile::GetCustomCommand(*ppcVar21);
      if (pcVar15 != (cmCustomCommand *)0x0) {
        psVar11 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this)
        ;
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  (&ccg,pcVar15,psVar11,
                   (cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
        cmLocalNinjaGenerator::AddCustomCommandTarget
                  ((this->super_cmNinjaTargetGenerator).LocalGenerator,pcVar15,
                   (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                   GeneratorTarget);
        pvVar12 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(&ccg);
        pvVar16 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
        _Var3._M_current =
             (pvVar12->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        _Var4._M_current =
             (pvVar12->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        MVar13.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                  (_Var3,_Var4,&deps,MVar13);
        _Var3._M_current =
             (pvVar16->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        _Var4._M_current =
             (pvVar16->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        MVar13.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                  (_Var3,_Var4,&deps,MVar13);
        cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
      }
      ppcVar21 = ppcVar21 + 1;
    } while (ppcVar21 !=
             sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  cmLocalNinjaGenerator::AppendTargetOutputs
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &outputs);
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &deps,DependOnTargetArtifact);
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar10 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar17 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&desc,&this->super_cmNinjaTargetGenerator);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&desc,0,(char *)0x0,0x5767fe);
    psVar18 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar18) {
      command.field_2._M_allocated_capacity = *psVar18;
      command.field_2._8_8_ = plVar9[3];
      command._M_dataplus._M_p = (pointer)&command.field_2;
    }
    else {
      command.field_2._M_allocated_capacity = *psVar18;
      command._M_dataplus._M_p = (pointer)*plVar9;
    }
    command._M_string_length = plVar9[1];
    *plVar9 = (long)psVar18;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    local_258.field_2._M_allocated_capacity = 0;
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
    local_168.field_2._M_allocated_capacity = 0;
    local_168._M_dataplus._M_p = (pointer)0x0;
    local_168._M_string_length = 0;
    ccg.Config.field_2._M_allocated_capacity = (size_type)&ccg.Config;
    ccg.Config._M_string_length = 0;
    ccg.CC = (cmCustomCommand *)0x0;
    ccg.Config._M_dataplus._M_p = (pointer)0x0;
    ccg.LG = (cmLocalGenerator *)0x0;
    ccg.Config.field_2._8_8_ = ccg.Config.field_2._M_allocated_capacity;
    cmGlobalNinjaGenerator::WritePhonyBuild
              (pcVar10,(ostream *)pcVar17,&command,&outputs,&deps,(cmNinjaDeps *)&local_258,
               (cmNinjaDeps *)&local_168,(cmNinjaVars *)&ccg);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&ccg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)command._M_dataplus._M_p != &command.field_2) {
      operator_delete(command._M_dataplus._M_p,command.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)desc._M_dataplus._M_p != &desc.field_2) {
      uVar19 = CONCAT71(desc.field_2._M_allocated_capacity._1_7_,desc.field_2._M_local_buf[0]);
      _Var20._M_p = desc._M_dataplus._M_p;
LAB_00374216:
      operator_delete(_Var20._M_p,uVar19 + 1);
    }
LAB_0037421e:
    TVar7 = cmGeneratorTarget::GetType
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    if (TVar7 == GLOBAL_TARGET) goto LAB_00374276;
    pcVar10 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
              ((string *)&ccg,&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddTargetAlias
              (pcVar10,(string *)&ccg,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
    uVar19 = ccg.Config._M_string_length;
    _Var20._M_p = (pointer)ccg.CC;
    if (ccg.CC == (cmCustomCommand *)&ccg.Config._M_string_length) goto LAB_00374276;
  }
  else {
    cmLocalNinjaGenerator::BuildCommandLine
              (&command,(this->super_cmNinjaTargetGenerator).LocalGenerator,&commands);
    this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    ccg.CC = (cmCustomCommand *)&ccg.Config._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ccg,"EchoString","");
    pcVar8 = cmGeneratorTarget::GetProperty(this_01,(string *)&ccg);
    if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
      operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
    }
    desc._M_dataplus._M_p = (pointer)&desc.field_2;
    desc._M_string_length = 0;
    desc.field_2._M_local_buf[0] = '\0';
    if (pcVar8 == (char *)0x0) {
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_258,&this->super_cmNinjaTargetGenerator);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,0x57681e);
      psVar18 = &ccg.Config._M_string_length;
      pcVar15 = (cmCustomCommand *)(plVar9 + 2);
      if ((cmCustomCommand *)*plVar9 == pcVar15) {
        ccg.Config._M_string_length =
             (size_type)
             (pcVar15->Outputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ccg.Config.field_2._M_allocated_capacity = plVar9[3];
        ccg.CC = (cmCustomCommand *)psVar18;
      }
      else {
        ccg.Config._M_string_length =
             (size_type)
             (pcVar15->Outputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ccg.CC = (cmCustomCommand *)*plVar9;
      }
      ccg.Config._M_dataplus._M_p = (pointer)plVar9[1];
      *plVar9 = (long)pcVar15;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)&desc,(string *)&ccg);
      if (ccg.CC != (cmCustomCommand *)psVar18) {
        operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&desc,0,(char *)0x0,(ulong)pcVar8);
    }
    pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    pcVar8 = cmLocalGenerator::GetSourceDirectory((cmLocalGenerator *)pcVar5);
    std::__cxx11::string::string((string *)&local_258,pcVar8,(allocator *)&local_168);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&ccg,
               &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_258,SHELL);
    cmsys::SystemTools::ReplaceString(&command,"$(CMAKE_SOURCE_DIR)",(char *)ccg.CC);
    if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
      operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
    }
    paVar1 = &local_258.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    pcVar8 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar5);
    std::__cxx11::string::string((string *)&local_258,pcVar8,(allocator *)&local_168);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&ccg,
               &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_258,SHELL);
    cmsys::SystemTools::ReplaceString(&command,"$(CMAKE_BINARY_DIR)",(char *)ccg.CC);
    if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
      operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ReplaceString(&command,"$(ARGS)","");
    lVar14 = std::__cxx11::string::find((char)&command,0x24);
    if (lVar14 == -1) {
      for (; util_outputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             util_outputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
          util_outputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               util_outputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        pcVar10 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        cmGlobalNinjaGenerator::SeenCustomCommandOutput
                  (pcVar10,util_outputs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      }
      pcVar10 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_258,&this->super_cmNinjaTargetGenerator);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,0x5767fe);
      ccg.CC = (cmCustomCommand *)&ccg.Config._M_string_length;
      pcVar15 = (cmCustomCommand *)(plVar9 + 2);
      if ((cmCustomCommand *)*plVar9 == pcVar15) {
        ccg.Config._M_string_length =
             (size_type)
             (pcVar15->Outputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ccg.Config.field_2._M_allocated_capacity = plVar9[3];
      }
      else {
        ccg.Config._M_string_length =
             (size_type)
             (pcVar15->Outputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ccg.CC = (cmCustomCommand *)*plVar9;
      }
      ccg.Config._M_dataplus._M_p = (pointer)plVar9[1];
      *plVar9 = (long)pcVar15;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"");
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGlobalNinjaGenerator::WriteCustomCommandBuild
                (pcVar10,&command,&desc,(string *)&ccg,&local_168,uses_terminal,true,&util_outputs,
                 &deps,&local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
        operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar1) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      pcVar10 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar17 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      local_258._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_168,1,&utilCommandName,&local_229);
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ccg.Config.field_2._M_allocated_capacity = (size_type)&ccg.Config;
      ccg.Config._M_string_length = 0;
      ccg.CC = (cmCustomCommand *)0x0;
      ccg.Config._M_dataplus._M_p = (pointer)0x0;
      ccg.LG = (cmLocalGenerator *)0x0;
      ccg.Config.field_2._8_8_ = ccg.Config.field_2._M_allocated_capacity;
      cmGlobalNinjaGenerator::WritePhonyBuild
                (pcVar10,(ostream *)pcVar17,&local_258,&outputs,(cmNinjaDeps *)&local_168,&local_78,
                 &local_48,(cmNinjaVars *)&ccg);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&ccg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar1) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)desc._M_dataplus._M_p != &desc.field_2) {
        operator_delete(desc._M_dataplus._M_p,
                        CONCAT71(desc.field_2._M_allocated_capacity._1_7_,
                                 desc.field_2._M_local_buf[0]) + 1);
      }
      uVar19 = command.field_2._M_allocated_capacity;
      _Var20._M_p = command._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)command._M_dataplus._M_p != &command.field_2) goto LAB_00374216;
      goto LAB_0037421e;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)desc._M_dataplus._M_p != &desc.field_2) {
      operator_delete(desc._M_dataplus._M_p,
                      CONCAT71(desc.field_2._M_allocated_capacity._1_7_,desc.field_2._M_local_buf[0]
                              ) + 1);
    }
    uVar19 = command.field_2._M_allocated_capacity;
    _Var20._M_p = command._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)command._M_dataplus._M_p == &command.field_2) goto LAB_00374276;
  }
  operator_delete(_Var20._M_p,uVar19 + 1);
LAB_00374276:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)config._M_dataplus._M_p != &config.field_2) {
    operator_delete(config._M_dataplus._M_p,config.field_2._M_allocated_capacity + 1);
  }
  if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&util_outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&deps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)utilCommandName._M_dataplus._M_p != &utilCommandName.field_2) {
    operator_delete(utilCommandName._M_dataplus._M_p,
                    utilCommandName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaUtilityTargetGenerator::Generate()
{
  std::string utilCommandName =
    this->GetLocalGenerator()->GetCurrentBinaryDirectory();
  utilCommandName += cmake::GetCMakeFilesDirectory();
  utilCommandName += "/";
  utilCommandName += this->GetTargetName() + ".util";
  utilCommandName = this->ConvertToNinjaPath(utilCommandName);

  std::vector<std::string> commands;
  cmNinjaDeps deps, outputs, util_outputs(1, utilCommandName);

  const std::vector<cmCustomCommand>* cmdLists[2] = {
    &this->GetGeneratorTarget()->GetPreBuildCommands(),
    &this->GetGeneratorTarget()->GetPostBuildCommands()
  };

  bool uses_terminal = false;

  for (unsigned i = 0; i != 2; ++i) {
    for (std::vector<cmCustomCommand>::const_iterator ci =
           cmdLists[i]->begin();
         ci != cmdLists[i]->end(); ++ci) {
      cmCustomCommandGenerator ccg(*ci, this->GetConfigName(),
                                   this->GetLocalGenerator());
      this->GetLocalGenerator()->AppendCustomCommandDeps(ccg, deps);
      this->GetLocalGenerator()->AppendCustomCommandLines(ccg, commands);
      std::vector<std::string> const& ccByproducts = ccg.GetByproducts();
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(util_outputs), MapToNinjaPath());
      if (ci->GetUsesTerminal()) {
        uses_terminal = true;
      }
    }
  }

  std::vector<cmSourceFile*> sources;
  std::string config =
    this->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");
  this->GetGeneratorTarget()->GetSourceFiles(sources, config);
  for (std::vector<cmSourceFile*>::const_iterator source = sources.begin();
       source != sources.end(); ++source) {
    if (cmCustomCommand* cc = (*source)->GetCustomCommand()) {
      cmCustomCommandGenerator ccg(*cc, this->GetConfigName(),
                                   this->GetLocalGenerator());
      this->GetLocalGenerator()->AddCustomCommandTarget(
        cc, this->GetGeneratorTarget());

      // Depend on all custom command outputs.
      const std::vector<std::string>& ccOutputs = ccg.GetOutputs();
      const std::vector<std::string>& ccByproducts = ccg.GetByproducts();
      std::transform(ccOutputs.begin(), ccOutputs.end(),
                     std::back_inserter(deps), MapToNinjaPath());
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(deps), MapToNinjaPath());
    }
  }

  this->GetLocalGenerator()->AppendTargetOutputs(this->GetGeneratorTarget(),
                                                 outputs);
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
                                                 deps);

  if (commands.empty()) {
    this->GetGlobalGenerator()->WritePhonyBuild(
      this->GetBuildFileStream(),
      "Utility command for " + this->GetTargetName(), outputs, deps);
  } else {
    std::string command =
      this->GetLocalGenerator()->BuildCommandLine(commands);
    const char* echoStr =
      this->GetGeneratorTarget()->GetProperty("EchoString");
    std::string desc;
    if (echoStr) {
      desc = echoStr;
    } else {
      desc = "Running utility command for " + this->GetTargetName();
    }

    // TODO: fix problematic global targets.  For now, search and replace the
    // makefile vars.
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_SOURCE_DIR)",
      this->GetLocalGenerator()
        ->ConvertToOutputFormat(
          this->GetLocalGenerator()->GetSourceDirectory(),
          cmOutputConverter::SHELL)
        .c_str());
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_BINARY_DIR)",
      this->GetLocalGenerator()
        ->ConvertToOutputFormat(
          this->GetLocalGenerator()->GetBinaryDirectory(),
          cmOutputConverter::SHELL)
        .c_str());
    cmSystemTools::ReplaceString(command, "$(ARGS)", "");

    if (command.find('$') != std::string::npos) {
      return;
    }

    for (cmNinjaDeps::const_iterator oi = util_outputs.begin(),
                                     oe = util_outputs.end();
         oi != oe; ++oi) {
      this->GetGlobalGenerator()->SeenCustomCommandOutput(*oi);
    }

    this->GetGlobalGenerator()->WriteCustomCommandBuild(
      command, desc, "Utility command for " + this->GetTargetName(),
      /*depfile*/ "", uses_terminal,
      /*restat*/ true, util_outputs, deps);

    this->GetGlobalGenerator()->WritePhonyBuild(
      this->GetBuildFileStream(), "", outputs,
      cmNinjaDeps(1, utilCommandName));
  }

  // Add an alias for the logical target name regardless of what directory
  // contains it.  Skip this for GLOBAL_TARGET because they are meant to
  // be per-directory and have one at the top-level anyway.
  if (this->GetGeneratorTarget()->GetType() != cmStateEnums::GLOBAL_TARGET) {
    this->GetGlobalGenerator()->AddTargetAlias(this->GetTargetName(),
                                               this->GetGeneratorTarget());
  }
}